

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_interpolation_qualifiers_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Bitset *flags)

{
  bool bVar1;
  uint uVar2;
  CompilerError *this_00;
  allocator local_39;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = (uint)flags->lower;
  if ((uVar2 >> 0xe & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    uVar2 = (this->options).version;
    if ((this->options).es == true) {
      if (uVar2 < 300) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"noperspective requires ESSL 300.");
        goto LAB_0027fed7;
      }
      ::std::__cxx11::string::string
                ((string *)&local_38,"GL_NV_shader_noperspective_interpolation",&local_39);
      require_extension_internal(this,&local_38);
LAB_0027fc22:
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    else if (uVar2 < 0x82) {
      ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_gpu_shader4",&local_39);
      require_extension_internal(this,&local_38);
      goto LAB_0027fc22;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((short)uVar2 < 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    if ((this->options).es == true) {
      uVar2 = (this->options).version;
      if (uVar2 < 300) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"sample requires ESSL 300.");
        goto LAB_0027fed7;
      }
      if (uVar2 < 0x140) {
        ::std::__cxx11::string::string
                  ((string *)&local_38,"GL_OES_shader_multisample_interpolation",&local_39);
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if (((uVar2 >> 0x12 & 1) != 0) &&
     (((this->options).es != false || (0x77 < (this->options).version)))) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  bVar1 = Bitset::get(flags,0x1497);
  if (bVar1) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::string((string *)&local_38,"GL_EXT_mesh_shader",&local_39);
    require_extension_internal(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Bitset::get(flags,4999);
  if (bVar1) {
    ::std::__cxx11::string::string
              ((string *)&local_38,"GL_AMD_shader_explicit_vertex_parameter",&local_39);
    require_extension_internal(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  bVar1 = Bitset::get(flags,0x14a5);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  bVar1 = (this->options).es;
  uVar2 = (this->options).version;
  if ((uVar2 < 0x140 & bVar1) == 1) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"pervertexEXT requires ESSL 320.");
  }
  else {
    if (bVar1 != false || 0x1c1 < uVar2) {
      if (this->barycentric_is_nv == true) {
        ::std::__cxx11::string::string
                  ((string *)&local_38,"GL_NV_fragment_shader_barycentric",&local_39);
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
      }
      else {
        ::std::__cxx11::string::string
                  ((string *)&local_38,"GL_EXT_fragment_shader_barycentric",&local_39);
        require_extension_internal(this,&local_38);
        ::std::__cxx11::string::~string((string *)&local_38);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"pervertexEXT requires GLSL 450.");
  }
LAB_0027fed7:
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string CompilerGLSL::to_interpolation_qualifiers(const Bitset &flags)
{
	string res;
	//if (flags & (1ull << DecorationSmooth))
	//    res += "smooth ";
	if (flags.get(DecorationFlat))
		res += "flat ";
	if (flags.get(DecorationNoPerspective))
	{
		if (options.es)
		{
			if (options.version < 300)
				SPIRV_CROSS_THROW("noperspective requires ESSL 300.");
			require_extension_internal("GL_NV_shader_noperspective_interpolation");
		}
		else if (is_legacy_desktop())
			require_extension_internal("GL_EXT_gpu_shader4");
		res += "noperspective ";
	}
	if (flags.get(DecorationCentroid))
		res += "centroid ";
	if (flags.get(DecorationPatch))
		res += "patch ";
	if (flags.get(DecorationSample))
	{
		if (options.es)
		{
			if (options.version < 300)
				SPIRV_CROSS_THROW("sample requires ESSL 300.");
			else if (options.version < 320)
				require_extension_internal("GL_OES_shader_multisample_interpolation");
		}
		res += "sample ";
	}
	if (flags.get(DecorationInvariant) && (options.es || options.version >= 120))
		res += "invariant ";
	if (flags.get(DecorationPerPrimitiveEXT))
	{
		res += "perprimitiveEXT ";
		require_extension_internal("GL_EXT_mesh_shader");
	}

	if (flags.get(DecorationExplicitInterpAMD))
	{
		require_extension_internal("GL_AMD_shader_explicit_vertex_parameter");
		res += "__explicitInterpAMD ";
	}

	if (flags.get(DecorationPerVertexKHR))
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("pervertexEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("pervertexEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			res += "pervertexNV ";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			res += "pervertexEXT ";
		}
	}

	return res;
}